

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_handle.c
# Opt level: O0

log_handle log_handle_initialize(log_handle handle)

{
  size_t sVar1;
  log_record plVar2;
  log_handle in_RDI;
  log_handle local_8;
  
  if (in_RDI == (log_handle)0x0) {
    local_8 = (log_handle)0x0;
  }
  else {
    sVar1 = log_record_size();
    plVar2 = (log_record)malloc(sVar1 << 8);
    in_RDI->buffer = plVar2;
    in_RDI->count = 0;
    in_RDI->size = 0x100;
    local_8 = in_RDI;
    if (in_RDI->buffer == (log_record)0x0) {
      free(in_RDI);
      local_8 = (log_handle)0x0;
    }
  }
  return local_8;
}

Assistant:

log_handle log_handle_initialize(log_handle handle)
{
	if (handle == NULL)
	{
		return NULL;
	}

	handle->buffer = malloc(LOG_HANDLE_RECORD_SIZE_DEFAULT * log_record_size());

	handle->count = 0;

	handle->size = LOG_HANDLE_RECORD_SIZE_DEFAULT;

	if (handle->buffer == NULL)
	{
		free(handle);

		return NULL;
	}

	return handle;
}